

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O2

void __thiscall KDReports::Test::testTabs(Test *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  const_reference pTVar4;
  qreal qVar5;
  QArrayDataPointer<QTextOption::Tab> local_c8;
  QList<QTextOption::Tab> tabs2;
  QList<QTextOption::Tab> tabs1;
  double local_80 [2];
  Report report;
  QTextBlock block3;
  QTextBlock block2;
  QFile file;
  QTextBlock block1;
  double local_18;
  
  QString::QString((QString *)&report,":/tabs.xml");
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar1 = (bool)QFile::open(&file,1);
  cVar2 = QTest::qVerify(bVar1,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xa5);
  if (cVar2 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    bVar1 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar2 = QTest::qVerify(bVar1,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xa7);
    if (cVar2 != '\0') {
      KDReports::Report::mainTextDocument();
      iVar3 = QTextDocument::blockCount();
      cVar2 = QTest::qCompare(iVar3,3,"doc.blockCount()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0xa9);
      if (cVar2 != '\0') {
        QTextDocument::toPlainText();
        QString::QString((QString *)&tabs2,"Left\tmiddle\tright\n0\t100\t200\nOnly a right margin");
        bVar1 = QTest::qCompare((QString *)&tabs1,(QString *)&tabs2,"doc.toPlainText()",
                                "QString(\"Left\\tmiddle\\tright\\n0\\t100\\t200\\nOnly a right margin\")"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0xaa);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tabs2);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tabs1);
        if (bVar1) {
          QTextDocument::firstBlock();
          QTextBlock::blockFormat();
          QTextBlockFormat::tabPositions();
          QTextFormat::~QTextFormat((QTextFormat *)&tabs2);
          cVar2 = QTest::qCompare(tabs1.d.size,2,"tabs1.count()","2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0xad);
          if (cVar2 != '\0') {
            pTVar4 = QList<QTextOption::Tab>::at(&tabs1,0);
            tabs2.d.d._0_4_ = 2;
            bVar1 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                              ((TabType *)(pTVar4 + 8),(TabType *)&tabs2,"tabs1[0].type",
                               "QTextOption::CenterTab",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                               ,0xae);
            if (bVar1) {
              pTVar4 = QList<QTextOption::Tab>::at(&tabs1,1);
              tabs2.d.d._0_4_ = 1;
              bVar1 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                                ((TabType *)(pTVar4 + 8),(TabType *)&tabs2,"tabs1[1].type",
                                 "QTextOption::RightTab",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                 ,0xaf);
              if (bVar1) {
                QTextBlock::next();
                QTextBlock::blockFormat();
                QTextBlockFormat::tabPositions();
                QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
                cVar2 = QTest::qCompare(tabs2.d.size,2,"tabs2.count()","2",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                        ,0xb2);
                if (cVar2 != '\0') {
                  pTVar4 = QList<QTextOption::Tab>::at(&tabs2,0);
                  local_c8.d._0_4_ = 0;
                  bVar1 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                                    ((TabType *)(pTVar4 + 8),(TabType *)&local_c8,"tabs2[0].type",
                                     "QTextOption::LeftTab",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                     ,0xb3);
                  if (bVar1) {
                    pTVar4 = QList<QTextOption::Tab>::at(&tabs2,1);
                    local_c8.d._0_4_ = 0;
                    bVar1 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                                      ((TabType *)(pTVar4 + 8),(TabType *)&local_c8,"tabs2[1].type",
                                       "QTextOption::LeftTab",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                       ,0xb4);
                    if (bVar1) {
                      QTextBlock::blockFormat();
                      qVar5 = QTextBlockFormat::leftMargin((QTextBlockFormat *)&local_c8);
                      cVar2 = QTest::qVerify(100.0 < qVar5,"block2.blockFormat().leftMargin() > 100"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                             ,0xb5);
                      QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
                      if (cVar2 != '\0') {
                        QTextBlock::blockFormat();
                        _block3 = QTextBlockFormat::rightMargin((QTextBlockFormat *)&local_c8);
                        local_80[0] = 0.0;
                        cVar2 = QTest::qCompare((double *)&block3,local_80,
                                                "block2.blockFormat().rightMargin()","qreal(0)",
                                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                                ,0xb6);
                        QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
                        if (cVar2 != '\0') {
                          QTextBlock::next();
                          QTextBlock::blockFormat();
                          QTextBlockFormat::tabPositions();
                          bVar1 = QTest::qCompare<QTextOption::Tab>
                                            ((QList<QTextOption::Tab> *)&local_c8,&tabs2,
                                             "block3.blockFormat().tabPositions()","tabs2",
                                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                             ,0xb8);
                          QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&local_c8);
                          QTextFormat::~QTextFormat((QTextFormat *)local_80);
                          if (bVar1) {
                            QTextBlock::blockFormat();
                            local_80[0] = QTextBlockFormat::leftMargin
                                                    ((QTextBlockFormat *)&local_c8);
                            local_18 = 0.0;
                            cVar2 = QTest::qCompare(local_80,&local_18,
                                                    "block3.blockFormat().leftMargin()","qreal(0)",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                                  ,0xb9);
                            QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
                            if (cVar2 != '\0') {
                              QTextBlock::blockFormat();
                              qVar5 = QTextBlockFormat::rightMargin((QTextBlockFormat *)&local_c8);
                              QTest::qVerify(100.0 < qVar5,
                                             "block3.blockFormat().rightMargin() > 100","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                             ,0xba);
                              QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
                QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&tabs2.d);
              }
            }
          }
          QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&tabs1.d);
        }
      }
    }
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void testTabs() // and paragraph margins
    {
        QFile file(":/tabs.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        QVERIFY(report.loadFromXML(&file));
        QTextDocument &doc = *report.mainTextDocument();
        QCOMPARE(doc.blockCount(), 3);
        QCOMPARE(doc.toPlainText(), QString("Left\tmiddle\tright\n0\t100\t200\nOnly a right margin"));
        QTextBlock block1 = doc.firstBlock();
        const QList<QTextOption::Tab> tabs1 = block1.blockFormat().tabPositions();
        QCOMPARE(tabs1.count(), 2);
        QCOMPARE(tabs1[0].type, QTextOption::CenterTab);
        QCOMPARE(tabs1[1].type, QTextOption::RightTab);
        QTextBlock block2 = block1.next();
        const QList<QTextOption::Tab> tabs2 = block2.blockFormat().tabPositions();
        QCOMPARE(tabs2.count(), 2);
        QCOMPARE(tabs2[0].type, QTextOption::LeftTab);
        QCOMPARE(tabs2[1].type, QTextOption::LeftTab);
        QVERIFY(block2.blockFormat().leftMargin() > 100);
        QCOMPARE(block2.blockFormat().rightMargin(), qreal(0));
        QTextBlock block3 = block2.next();
        QCOMPARE(block3.blockFormat().tabPositions(), tabs2);
        QCOMPARE(block3.blockFormat().leftMargin(), qreal(0));
        QVERIFY(block3.blockFormat().rightMargin() > 100);
    }